

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O2

state_sptr_t __thiscall
tchecker::zg::zg_t::clone_and_constrain(zg_t *this,const_state_sptr_t *s,clock_constraint_t *c)

{
  bool bVar1;
  make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *pmVar2;
  zone_t *pzVar3;
  db_t *dbm;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  ::operator*((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
               *)c);
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  construct_from_state<>
            ((state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
              *)this,(make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)(s + 0xe));
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                         *)this);
  pzVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator->(&(pmVar2->super_state_t)._zone)->super_zone_t;
  dbm = zone_t::dbm(pzVar3);
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                         *)this);
  pmVar4 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
           ::operator->(&(pmVar2->super_state_t)._zone);
  tchecker::dbm::constrain
            (dbm,(pmVar4->super_zone_t)._dim,
             (clock_constraint_t *)CONCAT71(in_register_00000009,in_CL));
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                         *)this);
  pzVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator*(&(pmVar2->super_state_t)._zone)->super_zone_t;
  bVar1 = zone_t::is_empty(pzVar3);
  if (!bVar1 && *(int *)&s[9]._t == 1) {
    details::
    state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
    share((state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           *)(s + 0xe),
          (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           *)this);
  }
  return (state_sptr_t)(make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::zg::state_sptr_t zg_t::clone_and_constrain(tchecker::zg::const_state_sptr_t const & s,
                                                     tchecker::clock_constraint_t const & c)
{
  tchecker::zg::state_sptr_t clone_s = _state_allocator.clone(*s);
  tchecker::dbm::constrain(clone_s->zone_ptr()->dbm(), clone_s->zone_ptr()->dim(), c);
  if (!clone_s->zone().is_empty() && _sharing_type == tchecker::ts::SHARING)
    share(clone_s);
  return clone_s;
}